

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

QModelIndex * __thiscall
QtMWidgets::PickerPrivate::indexForPos
          (QModelIndex *__return_storage_ptr__,PickerPrivate *this,QPoint *pos)

{
  QModelIndex *__return_storage_ptr___00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  QRect QVar6;
  QPersistentModelIndex index;
  QRect r;
  QPersistentModelIndex aQStack_58 [8];
  QModelIndex *local_50;
  QPoint local_48;
  int local_40;
  int local_3c;
  QPersistentModelIndex *local_38;
  
  iVar2 = this->drawItemOffset;
  local_38 = &this->topItemIndex;
  iVar4 = 0;
  local_50 = __return_storage_ptr__;
  while( true ) {
    if (this->itemsCount < iVar4) {
      local_50->r = -1;
      local_50->c = -1;
      local_50->i = 0;
      local_50->m = (QAbstractItemModel *)0x0;
      return local_50;
    }
    QVar6 = QWidget::rect(&this->q->super_QWidget);
    iVar3 = QVar6.x1 + this->itemSideMargin;
    QVar6 = QWidget::rect(&this->q->super_QWidget);
    local_40 = (QVar6.x2 + iVar3) - (QVar6.x1 + this->itemSideMargin);
    local_3c = iVar2 + this->stringHeight + -1;
    local_48.xp = iVar3;
    local_48.yp = iVar2;
    cVar1 = QRect::contains(&local_48,SUB81(pos,0));
    if (cVar1 != '\0') break;
    iVar2 = iVar2 + this->stringHeight + this->itemTopMargin;
    iVar4 = iVar4 + 1;
  }
  QPersistentModelIndex::QPersistentModelIndex(aQStack_58,local_38);
  __return_storage_ptr___00 = local_50;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    makeNextIndex(this,aQStack_58);
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr___00,aQStack_58);
  QPersistentModelIndex::~QPersistentModelIndex(aQStack_58);
  return __return_storage_ptr___00;
}

Assistant:

QModelIndex
PickerPrivate::indexForPos( const QPoint & pos )
{
	int offset = drawItemOffset;

	for( int i = 0; i < itemsCount + 1; ++i )
	{
		const QRect r( q->rect().x() + itemSideMargin, offset,
			q->rect().width() - itemSideMargin, stringHeight );

		if( r.contains( pos ) )
		{
			QPersistentModelIndex index = topItemIndex;

			for( int j = 0; j < i; ++j )
				makeNextIndex( index );

			return index;
		}

		offset += stringHeight + itemTopMargin;
	}

	return QModelIndex();
}